

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestCase * __thiscall
testing::internal::UnitTestImpl::GetTestCase
          (UnitTestImpl *this,char *test_case_name,char *type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *this_00;
  int iVar1;
  bool bVar2;
  TestCase *this_01;
  string local_a0 [32];
  string local_80;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
  local_60;
  undefined1 local_58 [32];
  TestCase *new_test_case;
  
  local_60.current._M_current =
       (__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
        )(this->test_cases_).
         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       (this->test_cases_).
       super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,test_case_name,(allocator<char> *)((long)&new_test_case + 7));
  std::__cxx11::string::string(local_a0,(string *)&local_80);
  local_58._8_8_ = set_up_tc;
  local_58._16_8_ = type_param;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase**,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>>,testing::internal::TestCaseNameIs>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>_>
              *)(local_58 + 0x18),&local_60,(TestCaseNameIs *)local_58);
  this_00 = &this->test_cases_;
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  if ((pointer)local_58._24_8_ ==
      (this_00->super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    this_01 = (TestCase *)operator_new(0xf8);
    TestCase::TestCase(this_01,test_case_name,(char *)local_58._16_8_,
                       (SetUpTestCaseFunc)local_58._8_8_,tear_down_tc);
    local_58._24_8_ = this_01;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,test_case_name,(allocator<char> *)((long)&new_test_case + 7));
    bVar2 = UnitTestOptions::MatchesFilter(&local_80,"*DeathTest:*DeathTest/*");
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar2) {
      iVar1 = this->last_death_test_case_;
      this->last_death_test_case_ = iVar1 + 1;
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::insert
                (this_00,(const_iterator)
                         ((this->test_cases_).
                          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar1 + 1),
                 (value_type *)(local_58 + 0x18));
    }
    else {
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::push_back
                (this_00,(value_type *)(local_58 + 0x18));
    }
    local_80._M_dataplus._M_p._0_4_ =
         (undefined4)
         ((ulong)((long)(this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->test_case_indices_,(int *)&local_80);
  }
  else {
    local_58._24_8_ = *(pointer)(local_58._24_8_ + -8);
  }
  return (TestCase *)local_58._24_8_;
}

Assistant:

TestCase* UnitTestImpl::GetTestCase(const char* test_case_name,
                                    const char* type_param,
                                    Test::SetUpTestCaseFunc set_up_tc,
                                    Test::TearDownTestCaseFunc tear_down_tc) {
  // Can we find a TestCase with the given name?
  const std::vector<TestCase*>::const_reverse_iterator test_case =
      std::find_if(test_cases_.rbegin(), test_cases_.rend(),
                   TestCaseNameIs(test_case_name));

  if (test_case != test_cases_.rend())
    return *test_case;

  // No.  Let's create one.
  TestCase* const new_test_case =
      new TestCase(test_case_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test case?
  if (internal::UnitTestOptions::MatchesFilter(test_case_name,
                                               kDeathTestCaseFilter)) {
    // Yes.  Inserts the test case after the last death test case
    // defined so far.  This only works when the test cases haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_case_;
    test_cases_.insert(test_cases_.begin() + last_death_test_case_,
                       new_test_case);
  } else {
    // No.  Appends to the end of the list.
    test_cases_.push_back(new_test_case);
  }

  test_case_indices_.push_back(static_cast<int>(test_case_indices_.size()));
  return new_test_case;
}